

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSDist_COF.cpp
# Opt level: O1

void __thiscall FSDist_COF::FSDist_COF(FSDist_COF *this,MADPComponentFactoredStates *a)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  size_type __n;
  pointer puVar1;
  size_t *psVar2;
  uint uVar3;
  ulong uVar4;
  allocator_type local_59;
  FSDist_COF *local_58;
  value_type_conflict3 local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  (this->super_FactoredStateDistribution).super_StateDistribution._vptr_StateDistribution =
       (_func_int **)&PTR__FSDist_COF_005e77e8;
  __n = a->_m_nrStateFactors;
  this->_m_nrStateFactors = __n;
  this_00 = &this->_m_sfacDomainSizes;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,__n,(allocator_type *)&local_48);
  local_58 = this;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_m_probs,a->_m_nrStateFactors,(allocator_type *)&local_48);
  if (a->_m_nrStateFactors != 0) {
    uVar3 = 1;
    uVar4 = 0;
    do {
      puVar1 = (a->_m_sfacDomainSizes).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(a->_m_sfacDomainSizes).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar4) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4
                  );
      }
      (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar4] = puVar1[uVar4];
      local_50 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_48,puVar1[uVar4],&local_50,&local_59);
      std::vector<double,_std::allocator<double>_>::_M_move_assign
                ((this->_m_probs).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar4,&local_48);
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 < a->_m_nrStateFactors);
  }
  psVar2 = IndexTools::CalculateStepSize(this_00);
  local_58->_m_stepSize = psVar2;
  return;
}

Assistant:

FSDist_COF::FSDist_COF(const MADPComponentFactoredStates& a) :
    _m_nrStateFactors(a.GetNrStateFactors()),
    _m_sfacDomainSizes(a.GetNrStateFactors()),
    _m_probs(a.GetNrStateFactors())
{
    for(Index i=0; i < a.GetNrStateFactors(); i++)
    {
        _m_sfacDomainSizes[i] = a.GetNrValuesForFactor(i);
        _m_probs[i] = vector<double>( a.GetNrValuesForFactor( i ), 0.0 );
    }
    _m_stepSize = IndexTools::CalculateStepSize(_m_sfacDomainSizes);
}